

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Sector_SetFade(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                     int arg4)

{
  uint uVar1;
  FSectorTagIterator local_30;
  
  if (arg0 == 0) {
    local_30.start = 0;
  }
  else {
    local_30.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
  }
  local_30.searchtag = arg0;
  uVar1 = FSectorTagIterator::Next(&local_30);
  if (-1 < (int)uVar1) {
    do {
      sector_t::SetFade(sectors + uVar1,arg1,arg2,arg3);
      uVar1 = FSectorTagIterator::Next(&local_30);
    } while (-1 < (int)uVar1);
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetFade)
// Sector_SetFade (tag, r, g, b)
{
	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		sectors[secnum].SetFade(arg1, arg2, arg3);
	}
	return true;
}